

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

int __thiscall
vkt::shaderexecutor::ShaderPackingFunctionTests::init
          (ShaderPackingFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  PackSnorm4x8Case *this_00;
  TestNode *pTVar2;
  PackUnorm4x8Case *this_01;
  PackSnorm2x16Case *this_02;
  PackUnorm2x16Case *this_03;
  int local_74;
  int local_70;
  int shaderTypeNdx_9;
  int shaderTypeNdx_8;
  int shaderTypeNdx_7;
  int shaderTypeNdx_6;
  int prec_3;
  int shaderTypeNdx_5;
  int shaderTypeNdx_4;
  int prec_2;
  ShaderType newShaderTypes [2];
  int shaderTypeNdx_3;
  int shaderTypeNdx_2;
  int prec_1;
  int shaderTypeNdx_1;
  int local_30;
  Precision local_2c;
  int shaderTypeNdx;
  int prec;
  ShaderType allShaderTypes [6];
  ShaderPackingFunctionTests *this_local;
  
  _shaderTypeNdx = 0x300000000;
  allShaderTypes[0] = SHADERTYPE_TESSELLATION_EVALUATION;
  allShaderTypes[1] = SHADERTYPE_GEOMETRY;
  allShaderTypes[2] = SHADERTYPE_FRAGMENT;
  allShaderTypes[3] = SHADERTYPE_COMPUTE;
  allShaderTypes._16_8_ = this;
  for (local_2c = PRECISION_MEDIUMP; (int)local_2c < 3; local_2c = local_2c + PRECISION_MEDIUMP) {
    for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
      this_00 = (PackSnorm4x8Case *)operator_new(0xf0);
      PackSnorm4x8Case::PackSnorm4x8Case
                (this_00,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 (&shaderTypeNdx)[local_30],local_2c);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    }
  }
  for (shaderTypeNdx_2 = 0; shaderTypeNdx_2 < 6; shaderTypeNdx_2 = shaderTypeNdx_2 + 1) {
    pTVar2 = (TestNode *)operator_new(0xe8);
    UnpackSnorm4x8Case::UnpackSnorm4x8Case
              ((UnpackSnorm4x8Case *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               (&shaderTypeNdx)[shaderTypeNdx_2]);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
  }
  for (shaderTypeNdx_3 = 1; shaderTypeNdx_3 < 3; shaderTypeNdx_3 = shaderTypeNdx_3 + 1) {
    for (newShaderTypes[1] = SHADERTYPE_VERTEX; (int)newShaderTypes[1] < 6;
        newShaderTypes[1] = newShaderTypes[1] + SHADERTYPE_FRAGMENT) {
      this_01 = (PackUnorm4x8Case *)operator_new(0xf0);
      PackUnorm4x8Case::PackUnorm4x8Case
                (this_01,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 (&shaderTypeNdx)[(int)newShaderTypes[1]],shaderTypeNdx_3);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
    }
  }
  for (newShaderTypes[0] = SHADERTYPE_VERTEX; (int)newShaderTypes[0] < 6;
      newShaderTypes[0] = newShaderTypes[0] + SHADERTYPE_FRAGMENT) {
    pTVar2 = (TestNode *)operator_new(0xe8);
    UnpackUnorm4x8Case::UnpackUnorm4x8Case
              ((UnpackUnorm4x8Case *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               (&shaderTypeNdx)[(int)newShaderTypes[0]]);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
  }
  _shaderTypeNdx_4 = 0x500000002;
  shaderTypeNdx_5 = 1;
  iVar1 = 2;
  while (shaderTypeNdx_5 < 3) {
    for (prec_3 = 0; prec_3 < 2; prec_3 = prec_3 + 1) {
      this_02 = (PackSnorm2x16Case *)operator_new(0xf0);
      PackSnorm2x16Case::PackSnorm2x16Case
                (this_02,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 (&shaderTypeNdx_4)[prec_3],shaderTypeNdx_5);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
    }
    shaderTypeNdx_5 = shaderTypeNdx_5 + 1;
    iVar1 = shaderTypeNdx_5;
  }
  shaderTypeNdx_6 = 0;
  while (shaderTypeNdx_6 < 2) {
    pTVar2 = (TestNode *)operator_new(0xe8);
    UnpackSnorm2x16Case::UnpackSnorm2x16Case
              ((UnpackSnorm2x16Case *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               (&shaderTypeNdx_4)[shaderTypeNdx_6]);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    shaderTypeNdx_6 = shaderTypeNdx_6 + 1;
    iVar1 = shaderTypeNdx_6;
  }
  shaderTypeNdx_7 = 1;
  while (shaderTypeNdx_7 < 3) {
    for (shaderTypeNdx_8 = 0; shaderTypeNdx_8 < 2; shaderTypeNdx_8 = shaderTypeNdx_8 + 1) {
      this_03 = (PackUnorm2x16Case *)operator_new(0xf0);
      PackUnorm2x16Case::PackUnorm2x16Case
                (this_03,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 (&shaderTypeNdx_4)[shaderTypeNdx_8],shaderTypeNdx_7);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
    }
    shaderTypeNdx_7 = shaderTypeNdx_7 + 1;
    iVar1 = shaderTypeNdx_7;
  }
  shaderTypeNdx_9 = 0;
  while (shaderTypeNdx_9 < 2) {
    pTVar2 = (TestNode *)operator_new(0xe8);
    UnpackUnorm2x16Case::UnpackUnorm2x16Case
              ((UnpackUnorm2x16Case *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               (&shaderTypeNdx_4)[shaderTypeNdx_9]);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    shaderTypeNdx_9 = shaderTypeNdx_9 + 1;
    iVar1 = shaderTypeNdx_9;
  }
  local_70 = 0;
  while (local_70 < 2) {
    pTVar2 = (TestNode *)operator_new(0xe8);
    PackHalf2x16Case::PackHalf2x16Case
              ((PackHalf2x16Case *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               (&shaderTypeNdx_4)[local_70]);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    local_70 = local_70 + 1;
    iVar1 = local_70;
  }
  local_74 = 0;
  while (local_74 < 2) {
    pTVar2 = (TestNode *)operator_new(0xe8);
    UnpackHalf2x16Case::UnpackHalf2x16Case
              ((UnpackHalf2x16Case *)pTVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               (&shaderTypeNdx_4)[local_74]);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    local_74 = local_74 + 1;
    iVar1 = local_74;
  }
  return iVar1;
}

Assistant:

void ShaderPackingFunctionTests::init (void)
{
	// New built-in functions in GLES 3.1
	{
		const glu::ShaderType allShaderTypes[] =
		{
			glu::SHADERTYPE_VERTEX,
			glu::SHADERTYPE_TESSELLATION_CONTROL,
			glu::SHADERTYPE_TESSELLATION_EVALUATION,
			glu::SHADERTYPE_GEOMETRY,
			glu::SHADERTYPE_FRAGMENT,
			glu::SHADERTYPE_COMPUTE
		};

		// packSnorm4x8
		for (int prec = glu::PRECISION_MEDIUMP; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
				addChild(new PackSnorm4x8Case(m_testCtx, allShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackSnorm4x8
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
			addChild(new UnpackSnorm4x8Case(m_testCtx, allShaderTypes[shaderTypeNdx]));

		// packUnorm4x8
		for (int prec = glu::PRECISION_MEDIUMP; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
				addChild(new PackUnorm4x8Case(m_testCtx, allShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackUnorm4x8
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
			addChild(new UnpackUnorm4x8Case(m_testCtx, allShaderTypes[shaderTypeNdx]));
	}

	// GLES 3 functions in new shader types.
	{
		const glu::ShaderType newShaderTypes[] =
		{
			glu::SHADERTYPE_GEOMETRY,
			glu::SHADERTYPE_COMPUTE
		};

		// packSnorm2x16
		for (int prec = glu::PRECISION_MEDIUMP; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
				addChild(new PackSnorm2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackSnorm2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackSnorm2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx]));

		// packUnorm2x16
		for (int prec = glu::PRECISION_MEDIUMP; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
				addChild(new PackUnorm2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackUnorm2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackUnorm2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx]));

		// packHalf2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new PackHalf2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx]));

		// unpackHalf2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackHalf2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx]));
	}
}